

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O3

bool GenerateAuthCookie(string *cookie_out,optional<std::filesystem::perms> cookie_perms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  path src;
  path dest;
  char cVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  perms p;
  undefined8 uVar7;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  Span<unsigned_char> bytes;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  error_code code;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  _List local_338;
  size_type in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffce0 [24];
  path local_2f0;
  path filepath;
  path filepath_tmp;
  ofstream file;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [14];
  ios_base local_180 [264];
  string cookie;
  uchar rand_pwd [32];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bytes.m_size = 0x20;
  bytes.m_data = rand_pwd;
  GetRandBytes(bytes);
  _file = (pointer)local_268;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&file,COOKIEAUTH_USER_abi_cxx11_._M_dataplus._M_p,
             COOKIEAUTH_USER_abi_cxx11_._M_dataplus._M_p +
             COOKIEAUTH_USER_abi_cxx11_._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,":");
  s.m_size = 0x20;
  s.m_data = rand_pwd;
  HexStr_abi_cxx11_((string *)&filepath_tmp,s);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_file != local_268) {
    uVar7 = local_268[0]._M_allocated_capacity;
  }
  if ((ulong)uVar7 < filepath_tmp.super_path._M_pathname._M_string_length + local_270) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filepath_tmp.super_path._M_pathname._M_dataplus._M_p !=
        &filepath_tmp.super_path._M_pathname.field_2) {
      uVar7 = filepath_tmp.super_path._M_pathname.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < filepath_tmp.super_path._M_pathname._M_string_length + local_270)
    goto LAB_00152275;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &filepath_tmp,0,0,_file,local_270);
  }
  else {
LAB_00152275:
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                       filepath_tmp.super_path._M_pathname._M_dataplus._M_p,
                       filepath_tmp.super_path._M_pathname._M_string_length);
  }
  cookie._M_dataplus._M_p = (pointer)&cookie.field_2;
  pcVar3 = (pbVar6->_M_dataplus)._M_p;
  paVar1 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    cookie.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    cookie.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
  }
  else {
    cookie.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    cookie._M_dataplus._M_p = pcVar3;
  }
  cookie._M_string_length = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar6->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filepath_tmp.super_path._M_pathname._M_dataplus._M_p !=
      &filepath_tmp.super_path._M_pathname.field_2) {
    operator_delete(filepath_tmp.super_path._M_pathname._M_dataplus._M_p,
                    filepath_tmp.super_path._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_file != local_268) {
    operator_delete(_file,local_268[0]._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(&file);
  GetAuthCookieFile(&filepath_tmp,true);
  std::ofstream::open((char *)&file,
                      (_Ios_Openmode)filepath_tmp.super_path._M_pathname._M_dataplus._M_p);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    paVar1 = &filepath.super_path._M_pathname.field_2;
    filepath.super_path._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&filepath,filepath_tmp.super_path._M_pathname._M_dataplus._M_p,
               filepath_tmp.super_path._M_pathname._M_dataplus._M_p +
               filepath_tmp.super_path._M_pathname._M_string_length);
    logging_function_00._M_str = "GenerateAuthCookie";
    logging_function_00._M_len = 0x12;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
    ;
    source_file_00._M_len = 0x5f;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,0x6f,ALL,Info,(ConstevalFormatString<1U>)0x1ae9ed,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filepath);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)filepath.super_path._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(filepath.super_path._M_pathname._M_dataplus._M_p,
                      filepath.super_path._M_pathname.field_2._M_allocated_capacity + 1);
    }
    bVar5 = false;
    goto LAB_00152727;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&file,cookie._M_dataplus._M_p,cookie._M_string_length);
  std::ofstream::close();
  GetAuthCookieFile(&filepath,false);
  std::filesystem::__cxx11::path::path(&local_2f0,&filepath_tmp.super_path);
  std::filesystem::__cxx11::path::path((path *)&stack0xfffffffffffffce8,&filepath.super_path);
  src.super_path._M_pathname._M_dataplus._M_p._4_4_ = code._4_4_;
  src.super_path._M_pathname._M_dataplus._M_p._0_4_ = code._M_value;
  src.super_path._M_pathname._M_string_length = (size_type)code._M_cat;
  src.super_path._M_pathname.field_2._M_allocated_capacity = local_348._M_allocated_capacity;
  src.super_path._M_pathname.field_2._8_8_ = local_348._8_8_;
  src.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       local_338._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  dest.super_path._M_pathname._M_string_length = in_stack_fffffffffffffcd8;
  dest.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffcd0;
  dest.super_path._M_pathname.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffce0._0_16_;
  dest.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )in_stack_fffffffffffffce0._16_8_;
  bVar5 = RenameOver(src,dest);
  std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffce8);
  std::filesystem::__cxx11::path::~path(&local_2f0);
  if (bVar5) {
    if (((ulong)cookie_perms.super__Optional_base<std::filesystem::perms,_true,_true>._M_payload.
                super__Optional_payload_base<std::filesystem::perms> >> 0x20 & 1) != 0) {
      code._M_value = 0;
      code._M_cat = (error_category *)std::_V2::system_category();
      std::filesystem::permissions
                (&filepath.super_path,
                 cookie_perms.super__Optional_base<std::filesystem::perms,_true,_true>._M_payload.
                 super__Optional_payload_base<std::filesystem::perms>._M_payload,replace,&code);
      if (code._M_value != 0) {
        local_338._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
             (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                )&stack0xfffffffffffffcd8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_338,filepath_tmp.super_path._M_pathname._M_dataplus._M_p,
                   filepath_tmp.super_path._M_pathname._M_dataplus._M_p +
                   filepath_tmp.super_path._M_pathname._M_string_length);
        logging_function._M_str = "GenerateAuthCookie";
        logging_function._M_len = 0x12;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
        ;
        source_file._M_len = 0x5f;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0x7e,ALL,Info,(ConstevalFormatString<1U>)0x1aea5d,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_338);
        if (local_338._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl !=
            (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
             )&stack0xfffffffffffffcd8) goto LAB_001525f4;
        goto LAB_00152601;
      }
    }
    g_generated_cookie = 1;
    local_338._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )&stack0xfffffffffffffcd8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,filepath.super_path._M_pathname._M_dataplus._M_p,
               filepath.super_path._M_pathname._M_dataplus._M_p +
               filepath.super_path._M_pathname._M_string_length);
    logging_function_02._M_str = "GenerateAuthCookie";
    logging_function_02._M_len = 0x12;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
    ;
    source_file_02._M_len = 0x5f;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_02,source_file_02,0x84,ALL,Info,(ConstevalFormatString<1U>)0x1aea99,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_338);
    if (local_338._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
        != (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )&stack0xfffffffffffffcd8) {
      operator_delete((void *)local_338._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              ._M_head_impl,in_stack_fffffffffffffcd8 + 1);
    }
    std::filesystem::status(&filepath.super_path);
    PermsToSymbolicString_abi_cxx11_((string *)&local_338,p);
    logging_function_03._M_str = "GenerateAuthCookie";
    logging_function_03._M_len = 0x12;
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
    ;
    source_file_03._M_len = 0x5f;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_03,source_file_03,0x85,ALL,Info,(ConstevalFormatString<1U>)0x1aeac1,
               (string *)&local_338);
    if (local_338._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
        != (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )&stack0xfffffffffffffcd8) {
      operator_delete((void *)local_338._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              ._M_head_impl,in_stack_fffffffffffffcd8 + 1);
    }
    bVar5 = true;
    if (cookie_out != (string *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (cookie_out,&cookie);
    }
  }
  else {
    local_338._M_impl._M_t.
    super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
    .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
         (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )&stack0xfffffffffffffcd8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,filepath_tmp.super_path._M_pathname._M_dataplus._M_p,
               filepath_tmp.super_path._M_pathname._M_dataplus._M_p +
               filepath_tmp.super_path._M_pathname._M_string_length);
    code._0_8_ = &local_348;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&code,filepath.super_path._M_pathname._M_dataplus._M_p,
               filepath.super_path._M_pathname._M_dataplus._M_p +
               filepath.super_path._M_pathname._M_string_length);
    logging_function_01._M_str = "GenerateAuthCookie";
    logging_function_01._M_len = 0x12;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
    ;
    source_file_01._M_len = 0x5f;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
              (logging_function_01,source_file_01,0x77,ALL,Info,(ConstevalFormatString<2U>)0x1aea27,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_338,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&code);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)code._0_8_ != &local_348) {
      operator_delete((void *)code._0_8_,local_348._M_allocated_capacity + 1);
    }
    if (local_338._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
        != (__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
            )&stack0xfffffffffffffcd8) {
LAB_001525f4:
      operator_delete((void *)local_338._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              ._M_head_impl,in_stack_fffffffffffffcd8 + 1);
    }
LAB_00152601:
    bVar5 = false;
  }
  std::filesystem::__cxx11::path::~path(&filepath.super_path);
LAB_00152727:
  std::filesystem::__cxx11::path::~path(&filepath_tmp.super_path);
  _file = _VTT;
  *(undefined8 *)(&file + *(long *)(_VTT + -0x18)) = __M_insert<void_const*>;
  std::filebuf::~filebuf((filebuf *)&local_270);
  std::ios_base::~ios_base(local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cookie._M_dataplus._M_p != &cookie.field_2) {
    operator_delete(cookie._M_dataplus._M_p,cookie.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool GenerateAuthCookie(std::string* cookie_out, std::optional<fs::perms> cookie_perms)
{
    const size_t COOKIE_SIZE = 32;
    unsigned char rand_pwd[COOKIE_SIZE];
    GetRandBytes(rand_pwd);
    std::string cookie = COOKIEAUTH_USER + ":" + HexStr(rand_pwd);

    /** the umask determines what permissions are used to create this file -
     * these are set to 0077 in common/system.cpp.
     */
    std::ofstream file;
    fs::path filepath_tmp = GetAuthCookieFile(true);
    file.open(filepath_tmp);
    if (!file.is_open()) {
        LogInfo("Unable to open cookie authentication file %s for writing\n", fs::PathToString(filepath_tmp));
        return false;
    }
    file << cookie;
    file.close();

    fs::path filepath = GetAuthCookieFile(false);
    if (!RenameOver(filepath_tmp, filepath)) {
        LogInfo("Unable to rename cookie authentication file %s to %s\n", fs::PathToString(filepath_tmp), fs::PathToString(filepath));
        return false;
    }
    if (cookie_perms) {
        std::error_code code;
        fs::permissions(filepath, cookie_perms.value(), fs::perm_options::replace, code);
        if (code) {
            LogInfo("Unable to set permissions on cookie authentication file %s\n", fs::PathToString(filepath_tmp));
            return false;
        }
    }

    g_generated_cookie = true;
    LogInfo("Generated RPC authentication cookie %s\n", fs::PathToString(filepath));
    LogInfo("Permissions used for cookie: %s\n", PermsToSymbolicString(fs::status(filepath).permissions()));

    if (cookie_out)
        *cookie_out = cookie;
    return true;
}